

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O2

int sproto_pack(void *srcv,int srcsz,void *bufferv,int bufsz)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  byte bVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint8_t *local_68;
  byte *local_60;
  uint8_t tmp [8];
  
  lVar9 = (long)srcsz;
  lVar11 = 0;
  local_68 = (uint8_t *)0x0;
  local_60 = (byte *)0x0;
  iVar5 = 0;
  iVar3 = 0;
  puVar2 = (uint8_t *)srcv;
  do {
    if (lVar9 <= lVar11) {
      if (-1 < bufsz) {
        if (iVar5 == 1) {
          iVar5 = 8;
        }
        else {
          if (iVar5 < 2) {
            return iVar3;
          }
          iVar5 = ((int)srcv - (int)local_68) + srcsz;
        }
        write_ff(local_68,local_60,iVar5);
      }
      return iVar3;
    }
    lVar11 = lVar11 + 8;
    lVar12 = lVar11 - lVar9;
    if (lVar12 != 0 && lVar9 <= lVar11) {
      memcpy(tmp,puVar2,8 - lVar12);
      puVar2 = tmp + 7;
      for (lVar4 = 0; lVar4 < lVar12; lVar4 = lVar4 + 1) {
        *puVar2 = '\0';
        puVar2 = puVar2 + -1;
      }
      puVar2 = tmp;
    }
    pbVar6 = (byte *)((long)bufferv + 1);
    iVar7 = bufsz + -1;
    bVar8 = 0;
    uVar10 = 0;
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      if (puVar2[lVar12] != 0) {
        uVar10 = uVar10 + 1;
        bVar8 = bVar8 | (byte)(1 << ((byte)lVar12 & 0x1f));
        if (0 < iVar7) {
          *pbVar6 = puVar2[lVar12];
          pbVar6 = pbVar6 + 1;
          iVar7 = iVar7 + -1;
        }
      }
    }
    pbVar6 = (byte *)bufferv;
    if (bufsz < 1) {
      pbVar6 = (byte *)0x0;
    }
    if (uVar10 == 8 || 0 < iVar5 && (uVar10 & 0xfffffffe) == 6) {
      if (iVar5 < 1) {
        bufsz = bufsz + -10;
LAB_00123378:
        iVar7 = 10;
        iVar1 = 1;
        local_68 = puVar2;
        local_60 = (byte *)bufferv;
      }
      else {
        bufsz = bufsz + -8;
LAB_00123364:
        if (iVar5 + 1 == 0x100) {
          if (-1 < bufsz) {
            write_ff(local_68,local_60,0x800);
          }
          iVar7 = 8;
          iVar1 = 0;
        }
        else {
          iVar7 = 8;
          iVar1 = iVar5 + 1;
        }
      }
    }
    else {
      if (pbVar6 != (byte *)0x0) {
        *pbVar6 = bVar8;
      }
      iVar7 = uVar10 + 1;
      bufsz = bufsz - iVar7;
      if (iVar7 == 10) goto LAB_00123378;
      if (0 < iVar5 && iVar7 == 8) goto LAB_00123364;
      iVar1 = iVar5;
      if ((0 < iVar5) && (iVar1 = 0, -1 < bufsz)) {
        write_ff(local_68,local_60,iVar5 << 3);
      }
    }
    iVar5 = iVar1;
    puVar2 = puVar2 + 8;
    bufferv = (void *)((long)bufferv + (long)iVar7);
    iVar3 = iVar7 + iVar3;
  } while( true );
}

Assistant:

int
sproto_pack(const void * srcv, int srcsz, void * bufferv, int bufsz) {
	uint8_t tmp[8];
	int i;
	const uint8_t * ff_srcstart = NULL;
	uint8_t * ff_desstart = NULL;
	int ff_n = 0;
	int size = 0;
	const uint8_t * src = srcv;
	uint8_t * buffer = bufferv;
	for (i=0;i<srcsz;i+=8) {
		int n;
		int padding = i+8 - srcsz;
		if (padding > 0) {
			int j;
			memcpy(tmp, src, 8-padding);
			for (j=0;j<padding;j++) {
				tmp[7-j] = 0;
			}
			src = tmp;
		}
		n = pack_seg(src, buffer, bufsz, ff_n);
		bufsz -= n;
		if (n == 10) {
			// first FF
			ff_srcstart = src;
			ff_desstart = buffer;
			ff_n = 1;
		} else if (n==8 && ff_n>0) {
			++ff_n;
			if (ff_n == 256) {
				if (bufsz >= 0) {
					write_ff(ff_srcstart, ff_desstart, 256*8);
				}
				ff_n = 0;
			}
		} else {
			if (ff_n > 0) {
				if (bufsz >= 0) {
					write_ff(ff_srcstart, ff_desstart, ff_n*8);
				}
				ff_n = 0;
			}
		}
		src += 8;
		buffer += n;
		size += n;
	}
	if(bufsz >= 0){
		if(ff_n == 1)
			write_ff(ff_srcstart, ff_desstart, 8);
		else if (ff_n > 1)
			write_ff(ff_srcstart, ff_desstart, srcsz - (intptr_t)(ff_srcstart - (const uint8_t*)srcv));
	}
	return size;
}